

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate-solution.cxx
# Opt level: O0

int main(int argc,char **argv)

{
  runtime_error *error;
  ProblemGraph problemGraph;
  Solution solution;
  Problem problem;
  Parameters parameters;
  char **in_stack_00000610;
  int in_stack_0000061c;
  Solution *in_stack_00000668;
  ProblemGraph *in_stack_00000670;
  ProblemGraph *in_stack_fffffffffffffe80;
  string *in_stack_fffffffffffffea0;
  string *in_stack_fffffffffffffea8;
  Problem *in_stack_ffffffffffffff18;
  ProblemGraph *in_stack_ffffffffffffff20;
  
  parseCommandLine(in_stack_0000061c,in_stack_00000610);
  lineage::loadProblem(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  lineage::loadSolution
            ((string *)
             problem.nodes.super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>._M_impl
             .super__Vector_impl_data._M_finish);
  lineage::ProblemGraph::ProblemGraph(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  lineage::validate(in_stack_00000670,in_stack_00000668);
  lineage::ProblemGraph::~ProblemGraph(in_stack_fffffffffffffe80);
  lineage::Solution::~Solution((Solution *)0x12932f);
  lineage::Problem::~Problem((Problem *)in_stack_fffffffffffffe80);
  Parameters::~Parameters((Parameters *)in_stack_fffffffffffffe80);
  return 0;
}

Assistant:

int main(int argc, char** argv)
try
{
    auto parameters = parseCommandLine(argc, argv);
    auto problem = lineage::loadProblem(parameters.nodesFileName, parameters.edgesFileName);
    auto solution = lineage::loadSolution(parameters.fragmentEdgeLabelsFileName);

    lineage::ProblemGraph problemGraph(problem);
    lineage::validate(problemGraph, solution);

    return 0;
}
catch (const runtime_error& error)
{
    cerr << "error: " << error.what() << endl;
    return 1;
}